

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void copy_suite::back_inserter_copy_if(void)

{
  pointer __value;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  iterator first_begin;
  iterator first_end;
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> expect;
  undefined8 local_7c;
  undefined4 local_74;
  vector<int,_std::allocator<int>_> input;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xde0000006f;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x1bc0000014d;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x22b;
  __l._M_len = 5;
  __l._M_array = (iterator)&expect;
  std::vector<int,_std::allocator<int>_>::vector(&input,__l,(allocator_type *)&local_7c);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&span;
  for (__value = input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      __value !=
      input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      __value = __value + 1) {
    if (0xde < *__value) {
      std::back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_>::operator=
                ((back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> *)&expect
                 ,__value);
    }
  }
  local_7c = 0x1bc0000014d;
  local_74 = 0x22b;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_7c;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_a9);
  first_begin = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  first_end = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x6a,"void copy_suite::back_inserter_copy_if()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void back_inserter_copy_if()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::vector<int> input = { 111, 222, 333, 444, 555 };
    std::copy_if(input.begin(), input.end(), std::back_inserter(span), [](int value) { return value > 222; });
    {
        std::vector<int> expect = { 333, 444, 555 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}